

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

int If_CutMerge(If_Man_t *p,If_Cut_t *pCut0,If_Cut_t *pCut1,If_Cut_t *pCut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar4;
  
  uVar1 = *(uint *)&pCut0->field_0x1c;
  uVar3 = uVar1 >> 0x18;
  uVar4 = (ulong)uVar3;
  uVar2 = *(uint *)&pCut1->field_0x1c;
  if (0xffffff < uVar2) {
    uVar5 = 0;
    do {
      if (0xffffff < uVar1) {
        uVar6 = 0;
        do {
          if ((&pCut1[1].Area)[uVar5] == (&pCut0[1].Area)[uVar6]) {
            p->pPerm[1][uVar5] = (int)uVar6;
            goto LAB_008c1225;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      if (uVar3 == (uVar1 >> 0x10 & 0xff)) {
        return 0;
      }
      p->pPerm[1][uVar5] = uVar3;
      lVar7 = (long)(int)uVar3;
      uVar3 = uVar3 + 1;
      (&pCut[1].Area)[lVar7] = (&pCut1[1].Area)[uVar5];
LAB_008c1225:
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar2 >> 0x18);
  }
  if (0xffffff < uVar1) {
    uVar5 = 0;
    do {
      (&pCut[1].Area)[uVar5] = (&pCut0[1].Area)[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  pCut->field_0x1f = (char)uVar3;
  pCut->uSign = pCut1->uSign | pCut0->uSign;
  return 1;
}

Assistant:

int If_CutMerge( If_Man_t * p, If_Cut_t * pCut0, If_Cut_t * pCut1, If_Cut_t * pCut )
{ 
    int nLutSize = pCut0->nLimit;
    int nSize0 = pCut0->nLeaves;
    int nSize1 = pCut1->nLeaves;
    int * pC0 = pCut0->pLeaves;
    int * pC1 = pCut1->pLeaves;
    int * pC = pCut->pLeaves;
    int i, k, c;
    // compare two cuts with different numbers
    c = nSize0; 
    for ( i = 0; i < nSize1; i++ )
    {
        for ( k = 0; k < nSize0; k++ )
            if ( pC1[i] == pC0[k] )
                break;
        if ( k < nSize0 )
        {
            p->pPerm[1][i] = k;
            continue;
        }
        if ( c == nLutSize )
            return 0;
        p->pPerm[1][i] = c;
        pC[c++] = pC1[i];
    }
    for ( i = 0; i < nSize0; i++ )
        pC[i] = pC0[i];
    pCut->nLeaves = c;
    pCut->uSign = pCut0->uSign | pCut1->uSign;
    return 1;
}